

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

void update_xz_tilde(OSQPWorkspace *work)

{
  OSQPWorkspace *in_RDI;
  
  compute_rhs(in_RDI);
  (*in_RDI->linsys_solver->solve)(in_RDI->linsys_solver,in_RDI->xz_tilde);
  return;
}

Assistant:

void update_xz_tilde(OSQPWorkspace *work) {
  // Compute right-hand side
  compute_rhs(work);

  // Solve linear system
  work->linsys_solver->solve(work->linsys_solver, work->xz_tilde);
}